

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::setBasis(Highs *this,HighsBasis *basis,string *origin)

{
  uint uVar1;
  bool bVar2;
  HighsStatus HVar3;
  const_reference pvVar4;
  reference pvVar5;
  size_type sVar6;
  size_type sVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  HighsLogOptions *log_options_;
  string *in_RDX;
  long in_RSI;
  long in_RDI;
  HighsStatus return_status;
  HighsLpSolverObject solver_object;
  HighsBasis modifiable_basis;
  HighsInt iCol;
  HighsCallback *in_stack_fffffffffffffe98;
  undefined4 uVar10;
  HighsOptions *in_stack_fffffffffffffea0;
  HighsLp *in_stack_fffffffffffffea8;
  HighsBasis *in_stack_fffffffffffffeb8;
  HighsBasis *in_stack_fffffffffffffec0;
  value_type local_111;
  string local_108 [32];
  HighsInt in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  uint uVar11;
  undefined1 b;
  HighsLpSolverObject local_d0;
  bool local_85;
  undefined1 in_stack_ffffffffffffff87;
  HighsLpSolverObject *in_stack_ffffffffffffff88;
  int local_24;
  HighsStatus local_4;
  
  b = (undefined1)((uint)in_stack_ffffffffffffff1c >> 0x18);
  if ((*(byte *)(in_RSI + 1) & 1) == 0) {
    bVar2 = isBasisConsistent(in_stack_fffffffffffffea8,(HighsBasis *)in_stack_fffffffffffffea0);
    if (!bVar2) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,"setBasis: invalid basis\n");
      return kError;
    }
    HighsBasis::operator=
              ((HighsBasis *)in_stack_fffffffffffffea0,(HighsBasis *)in_stack_fffffffffffffe98);
  }
  else if (*(int *)(in_RDI + 0x13c) == 0) {
    for (local_24 = 0; b = (undefined1)((uint)in_stack_ffffffffffffff1c >> 0x18),
        local_24 < *(int *)(in_RDI + 0x138); local_24 = local_24 + 1) {
      pvVar4 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_RSI + 0x30),(long)local_24);
      if (*pvVar4 == kBasic) {
        local_111 = kNonbasic;
      }
      else {
        pvVar4 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                           ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                            (in_RSI + 0x30),(long)local_24);
        local_111 = *pvVar4;
      }
      pvVar5 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                         ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                          (in_RDI + 0xa0),(long)local_24);
      *pvVar5 = local_111;
    }
    *(undefined1 *)(in_RDI + 0x71) = 0;
  }
  else {
    bVar2 = isBasisRightSize((HighsLp *)in_stack_fffffffffffffea0,
                             (HighsBasis *)in_stack_fffffffffffffe98);
    uVar10 = (undefined4)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    if (!bVar2) {
      sVar6 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size
                        ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                         (in_RDI + 0xa0));
      sVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::size
                        ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                         (in_RDI + 0xb8));
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                   "setBasis: User basis is rejected due to mismatch between size of column and row status vectors (%d, %d) and number of columns and rows in the model (%d, %d)\n"
                   ,sVar6 & 0xffffffff,sVar7 & 0xffffffff,(ulong)*(uint *)(in_RDI + 0x138),
                   CONCAT44(uVar10,*(undefined4 *)(in_RDI + 0x13c)));
      return kError;
    }
    HighsBasis::HighsBasis(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    local_85 = true;
    in_stack_fffffffffffffe98 = (HighsCallback *)(in_RDI + 0x9a8);
    in_stack_fffffffffffffea0 = (HighsOptions *)(in_RDI + 0xaa8);
    HighsLpSolverObject::HighsLpSolverObject
              (&local_d0,(HighsLp *)(in_RDI + 0x138),(HighsBasis *)&stack0xffffffffffffff78,
               (HighsSolution *)(in_RDI + 8),(HighsInfo *)(in_RDI + 0xea8),(HEkk *)(in_RDI + 0x12f8)
               ,in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,(HighsTimer *)(in_RDI + 0x920));
    HVar3 = formSimplexLpBasisAndFactor(in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87);
    if (HVar3 == kOk) {
      HighsBasis::operator=
                ((HighsBasis *)in_stack_fffffffffffffea0,(HighsBasis *)in_stack_fffffffffffffe98);
    }
    else {
      local_4 = kError;
    }
    uVar11 = (uint)(HVar3 != kOk);
    HighsBasis::~HighsBasis((HighsBasis *)in_stack_fffffffffffffea0);
    if (uVar11 != 0) {
      return local_4;
    }
    b = 0;
  }
  *(undefined1 *)(in_RDI + 0x70) = 1;
  *(undefined1 *)(in_RDI + 0x72) = 1;
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffea0,(char *)in_stack_fffffffffffffe98);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x80),in_RDX);
  }
  if ((*(byte *)(in_RDI + 0x73) & 1) != 0) {
    log_options_ = (HighsLogOptions *)(in_RDI + 0xe28);
    highsBoolToString_abi_cxx11_((bool)b,in_stack_ffffffffffffff18);
    uVar8 = std::__cxx11::string::c_str();
    uVar11 = *(uint *)(in_RDI + 0x74);
    uVar1 = *(uint *)(in_RDI + 0x78);
    uVar9 = std::__cxx11::string::c_str();
    highsLogDev(log_options_,kInfo,
                "Highs::setBasis Was alien = %-5s; Id = %9d; UpdateCount = %4d; Origin (%s)\n",uVar8
                ,(ulong)uVar11,(ulong)uVar1,uVar9);
    std::__cxx11::string::~string(local_108);
  }
  newHighsBasis((Highs *)0x491e18);
  return kOk;
}

Assistant:

HighsStatus Highs::setBasis(const HighsBasis& basis,
                            const std::string& origin) {
  if (basis.alien) {
    // An alien basis needs to be checked properly, since it may be
    // singular, or even incomplete.
    if (model_.lp_.num_row_ == 0) {
      // Special case where there are no rows, so no singularity
      // issues. All columns with basic status must be set nonbasic
      for (HighsInt iCol = 0; iCol < model_.lp_.num_col_; iCol++)
        basis_.col_status[iCol] =
            basis.col_status[iCol] == HighsBasisStatus::kBasic
                ? HighsBasisStatus::kNonbasic
                : basis.col_status[iCol];
      basis_.alien = false;
    } else {
      // Check whether a new basis can be defined
      if (!isBasisRightSize(model_.lp_, basis)) {
        highsLogUser(
            options_.log_options, HighsLogType::kError,
            "setBasis: User basis is rejected due to mismatch between "
            "size of column and row status vectors (%d, %d) and number "
            "of columns and rows in the model (%d, %d)\n",
            int(basis_.col_status.size()), int(basis_.row_status.size()),
            int(model_.lp_.num_col_), int(model_.lp_.num_row_));
        return HighsStatus::kError;
      }
      HighsBasis modifiable_basis = basis;
      modifiable_basis.was_alien = true;
      HighsLpSolverObject solver_object(model_.lp_, modifiable_basis, solution_,
                                        info_, ekk_instance_, callback_,
                                        options_, timer_);
      HighsStatus return_status = formSimplexLpBasisAndFactor(solver_object);
      if (return_status != HighsStatus::kOk) return HighsStatus::kError;
      // Update the HiGHS basis
      basis_ = std::move(modifiable_basis);
    }
  } else {
    // Check the user-supplied basis
    if (!isBasisConsistent(model_.lp_, basis)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "setBasis: invalid basis\n");
      return HighsStatus::kError;
    }
    // Update the HiGHS basis
    basis_ = basis;
  }
  basis_.valid = true;
  basis_.useful = true;
  if (origin != "") basis_.debug_origin_name = origin;
  assert(basis_.debug_origin_name != "");
  assert(!basis_.alien);
  if (basis_.was_alien) {
    highsLogDev(
        options_.log_options, HighsLogType::kInfo,
        "Highs::setBasis Was alien = %-5s; Id = %9d; UpdateCount = %4d; Origin "
        "(%s)\n",
        highsBoolToString(basis_.was_alien).c_str(), (int)basis_.debug_id,
        (int)basis_.debug_update_count, basis_.debug_origin_name.c_str());
  }

  // Follow implications of a new HiGHS basis
  newHighsBasis();
  // Can't use returnFromHighs since...
  return HighsStatus::kOk;
}